

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall hgdb::json::Module::serialize_(Module *this,JSONWriter *w)

{
  bool bVar1;
  JSONWriter *pJVar2;
  char *pcVar3;
  variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *this_00;
  variant_alternative_t<1UL,_variant<Variable,_unsigned_long>_> *pvVar4;
  int __c;
  __normal_iterator<const_std::variant<hgdb::json::Variable,_unsigned_long>_*,_std::vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>_>
  *__rhs;
  string local_148;
  variant<hgdb::json::Variable,_unsigned_long> *local_128;
  variant<hgdb::json::Variable,_unsigned_long> *v;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
  *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string_view local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string_view local_a8;
  type *local_98;
  type *m;
  type *name;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>_>
  local_80;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string_view local_28;
  JSONWriter *local_18;
  JSONWriter *w_local;
  Module *this_local;
  
  local_18 = w;
  w_local = (JSONWriter *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"name");
  pJVar2 = JSONWriter::key(w,local_28);
  std::__cxx11::string::string((string *)&local_48,(string *)&this->name_);
  JSONWriter::value<std::__cxx11::string>(pJVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pJVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"instances");
  pJVar2 = JSONWriter::key(pJVar2,___range2);
  JSONWriter::begin_array(pJVar2);
  __end2 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>
           ::begin(&this->instances_);
  local_80._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>
          ::end(&this->instances_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&local_80);
    if (!bVar1) break;
    name = &__gnu_cxx::
            __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>_>
            ::operator*(&__end2)->first;
    m = (type *)std::get<0ul,std::__cxx11::string,hgdb::json::Module_const*>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>
                            *)name);
    local_98 = std::get<1ul,std::__cxx11::string,hgdb::json::Module_const*>
                         ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>
                           *)name);
    pJVar2 = JSONWriter::begin_obj(local_18);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"name");
    pJVar2 = JSONWriter::key(pJVar2,local_a8);
    std::__cxx11::string::string((string *)&local_c8,(string *)m);
    pJVar2 = JSONWriter::value<std::__cxx11::string>(pJVar2,&local_c8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8,"module");
    pJVar2 = JSONWriter::key(pJVar2,local_d8);
    std::__cxx11::string::string((string *)&local_f8,(string *)&(*local_98)->name_);
    pJVar2 = JSONWriter::value<std::__cxx11::string>(pJVar2,&local_f8);
    JSONWriter::end_obj(pJVar2);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_c8);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>_>
    ::operator++(&__end2);
  }
  JSONWriter::end_array(local_18);
  pJVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range2_1,"variables");
  pJVar2 = JSONWriter::key(pJVar2,___range2_1);
  JSONWriter::begin_array(pJVar2);
  __end2_1 = std::
             vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
             ::begin(&this->variables_);
  v = (variant<hgdb::json::Variable,_unsigned_long> *)
      std::
      vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
      ::end(&this->variables_);
  while( true ) {
    __rhs = (__normal_iterator<const_std::variant<hgdb::json::Variable,_unsigned_long>_*,_std::vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>_>
             *)&v;
    bVar1 = __gnu_cxx::operator!=(&__end2_1,__rhs);
    if (!bVar1) break;
    local_128 = __gnu_cxx::
                __normal_iterator<const_std::variant<hgdb::json::Variable,_unsigned_long>_*,_std::vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>_>
                ::operator*(&__end2_1);
    pcVar3 = std::variant<hgdb::json::Variable,_unsigned_long>::index(local_128,(char *)__rhs,__c);
    pJVar2 = local_18;
    if (pcVar3 == (char *)0x0) {
      this_00 = std::get<0ul,hgdb::json::Variable,unsigned_long>(local_128);
      Variable::serialize(this_00,local_18);
    }
    else {
      pvVar4 = std::get<1ul,hgdb::json::Variable,unsigned_long>(local_128);
      std::__cxx11::to_string(&local_148,*pvVar4);
      JSONWriter::value<std::__cxx11::string>(pJVar2,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
    }
    __gnu_cxx::
    __normal_iterator<const_std::variant<hgdb::json::Variable,_unsigned_long>_*,_std::vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>_>
    ::operator++(&__end2_1);
  }
  JSONWriter::end_array(local_18);
  return;
}

Assistant:

void serialize_(JSONWriter &w) const override {
        w.key("name").value(name_);
        w.key("instances").begin_array();
        for (auto const &[name, m] : instances_) {
            w.begin_obj().key("name").value(name).key("module").value(m->name_).end_obj();
        }
        w.end_array();
        w.key("variables").begin_array();
        for (auto const &v : variables_) {
            if (v.index() == 0) {
                std::get<0>(v).serialize(w);
            } else {
                w.value(std::to_string(std::get<1>(v)));
            }
        }
        w.end_array();
    }